

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.cpp
# Opt level: O3

optional_ptr<duckdb::Catalog,_true>
duckdb::Catalog::GetCatalogEntry(CatalogEntryRetriever *retriever,string *catalog_name)

{
  ClientContext *db;
  bool bVar1;
  int iVar2;
  DatabaseManager *this;
  optional_ptr<duckdb::Catalog,_true> oVar3;
  ClientData *pCVar4;
  AttachedDatabase *this_00;
  type db_00;
  optional_ptr<duckdb::AttachedDatabase,_true> entry;
  optional_ptr<duckdb::AttachedDatabase,_true> local_28;
  
  db = retriever->context;
  this = DatabaseManager::Get(db);
  iVar2 = ::std::__cxx11::string::compare((char *)catalog_name);
  if (iVar2 == 0) {
    pCVar4 = ClientData::Get(db);
    this_00 = shared_ptr<duckdb::AttachedDatabase,_true>::operator->(&pCVar4->temporary_objects);
    oVar3.ptr = AttachedDatabase::GetCatalog(this_00);
    return (optional_ptr<duckdb::Catalog,_true>)oVar3.ptr;
  }
  iVar2 = ::std::__cxx11::string::compare((char *)catalog_name);
  if (iVar2 != 0) {
    bVar1 = IsInvalidCatalog(catalog_name);
    if (bVar1) {
      catalog_name = DatabaseManager::GetDefaultDatabase_abi_cxx11_(retriever->context);
    }
    local_28 = DatabaseManager::GetDatabase(this,db,catalog_name);
    if (local_28.ptr == (AttachedDatabase *)0x0) {
      oVar3.ptr = (Catalog *)0x0;
    }
    else {
      optional_ptr<duckdb::AttachedDatabase,_true>::CheckValid(&local_28);
      oVar3.ptr = AttachedDatabase::GetCatalog(local_28.ptr);
    }
    return (optional_ptr<duckdb::Catalog,_true>)oVar3.ptr;
  }
  db_00 = shared_ptr<duckdb::DatabaseInstance,_true>::operator*(&db->db);
  oVar3.ptr = GetSystemCatalog(db_00);
  return (optional_ptr<duckdb::Catalog,_true>)oVar3.ptr;
}

Assistant:

optional_ptr<Catalog> Catalog::GetCatalogEntry(CatalogEntryRetriever &retriever, const string &catalog_name) {
	auto &context = retriever.GetContext();
	auto &db_manager = DatabaseManager::Get(context);
	if (catalog_name == TEMP_CATALOG) {
		return &ClientData::Get(context).temporary_objects->GetCatalog();
	}
	if (catalog_name == SYSTEM_CATALOG) {
		return &GetSystemCatalog(context);
	}
	auto entry =
	    db_manager.GetDatabase(context, IsInvalidCatalog(catalog_name) ? GetDefaultCatalog(retriever) : catalog_name);
	if (!entry) {
		return nullptr;
	}
	return &entry->GetCatalog();
}